

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_proxy.cpp
# Opt level: O2

Error * __thiscall
ot::commissioner::ProxyClient::SetMeshLocalPrefix
          (Error *__return_storage_ptr__,ProxyClient *this,ByteArray *aMeshLocalPrefix)

{
  char cVar1;
  uchar *__first1;
  bool bVar2;
  char *pcVar3;
  char *pcVar4;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string_view fmt;
  format_args args;
  format_args args_00;
  uint8_t meshLocalPrefix [1];
  writer write;
  string local_a0;
  undefined1 local_80 [40];
  format_string_checker<char> local_58;
  
  __return_storage_ptr__->mCode = kNone;
  meshLocalPrefix[0] = 0xfd;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  __first1 = (aMeshLocalPrefix->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
             _M_impl.super__Vector_impl_data._M_start;
  if ((long)(aMeshLocalPrefix->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
            _M_impl.super__Vector_impl_data._M_finish - (long)__first1 == 8) {
    bVar2 = std::__equal<true>::equal<unsigned_char>(__first1,__first1 + 1,meshLocalPrefix);
    if (bVar2) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (&this->mMeshLocalPrefix,aMeshLocalPrefix);
      return __return_storage_ptr__;
    }
    local_58._0_8_ = (ulong)(uint)local_58._4_4_ << 0x20;
    local_58.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         "Thread Mesh-Local Prefix must start with fd00::/8";
    local_58.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x31;
    local_58.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
    local_58.context_.super_basic_format_parse_context<char>._20_4_ = 0;
    local_58.parse_funcs_[0] = (parse_func)0x0;
    pcVar3 = "Thread Mesh-Local Prefix must start with fd00::/8";
    write.handler_ = &local_58;
    local_58.context_.types_ = local_58.types_;
    while (pcVar3 != "") {
      cVar1 = *pcVar3;
      pcVar4 = pcVar3;
      while (cVar1 != '{') {
        pcVar4 = pcVar4 + 1;
        if (pcVar4 == "") {
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()((writer *)&write,pcVar3,"");
          goto LAB_0017b3d1;
        }
        cVar1 = *pcVar4;
      }
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
      operator()((writer *)&write,pcVar3,pcVar4);
      pcVar3 = ::fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                         (pcVar4,"",&local_58);
    }
LAB_0017b3d1:
    args_00.field_1.args_ = in_R9.args_;
    args_00.desc_ = (unsigned_long_long)&local_58;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_a0,(v10 *)"Thread Mesh-Local Prefix must start with fd00::/8",
               (string_view)ZEXT816(0x31),args_00);
    local_80._0_4_ = kInvalidArgs;
    std::__cxx11::string::string((string *)(local_80 + 8),(string *)&local_a0);
  }
  else {
    local_58.types_[0] = ulong_long_type;
    local_58.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         "Thread Mesh-Local Prefix length must be {}";
    local_58.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x2a;
    local_58.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
    local_58.context_.super_basic_format_parse_context<char>._20_4_ = 1;
    local_58.parse_funcs_[0] =
         ::fmt::v10::detail::
         parse_format_specs<unsigned_long,fmt::v10::detail::compile_parse_context<char>>;
    pcVar3 = "Thread Mesh-Local Prefix length must be {}";
    write.handler_ = &local_58;
    local_58.context_.types_ = local_58.types_;
    while (pcVar3 != "") {
      cVar1 = *pcVar3;
      pcVar4 = pcVar3;
      while (cVar1 != '{') {
        pcVar4 = pcVar4 + 1;
        if (pcVar4 == "") {
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_unsigned_long>_>
          ::writer::operator()(&write,pcVar3,"");
          goto LAB_0017b2ff;
        }
        cVar1 = *pcVar4;
      }
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_unsigned_long>_>
      ::writer::operator()(&write,pcVar3,pcVar4);
      pcVar3 = ::fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,unsigned_long>&>
                         (pcVar4,"",&local_58);
    }
LAB_0017b2ff:
    local_58._0_8_ = 8;
    fmt.size_ = 4;
    fmt.data_ = (char *)0x2a;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_58;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_a0,(v10 *)"Thread Mesh-Local Prefix length must be {}",fmt,args);
    local_80._0_4_ = kInvalidArgs;
    std::__cxx11::string::string((string *)(local_80 + 8),(string *)&local_a0);
  }
  Error::operator=(__return_storage_ptr__,(Error *)local_80);
  std::__cxx11::string::~string((string *)(local_80 + 8));
  std::__cxx11::string::~string((string *)&local_a0);
  return __return_storage_ptr__;
}

Assistant:

Error ProxyClient::SetMeshLocalPrefix(const ByteArray &aMeshLocalPrefix)
{
    constexpr uint8_t meshLocalPrefix[] = {0xfd};
    Error             error;

    VerifyOrExit(aMeshLocalPrefix.size() == kMeshLocalPrefixLength,
                 error = ERROR_INVALID_ARGS("Thread Mesh-Local Prefix length must be {}", kMeshLocalPrefixLength));
    VerifyOrExit(
        std::equal(aMeshLocalPrefix.begin(), aMeshLocalPrefix.begin() + sizeof(meshLocalPrefix), meshLocalPrefix),
        error = ERROR_INVALID_ARGS("Thread Mesh-Local Prefix must start with fd00::/8"));

    mMeshLocalPrefix = aMeshLocalPrefix;

exit:
    return error;
}